

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O2

void __thiscall
toml::result<toml::basic_value<toml::type_config>,_toml::error_info>::cleanup
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *this,EVP_PKEY_CTX *ctx)

{
  if (this->is_ok_ == true) {
    basic_value<toml::type_config>::~basic_value(&(this->field_1).succ_.value);
    return;
  }
  std::__cxx11::string::~string
            ((string *)
             (this->field_1).succ_.value.field_1.integer_.format.suffix.field_2._M_local_buf);
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&(this->field_1).succ_.value.field_1.integer_.format.spacer);
  std::__cxx11::string::~string((string *)&(this->field_1).succ_);
  return;
}

Assistant:

void cleanup() noexcept
    {
#if defined(__GNUC__) && ! defined(__clang__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wduplicated-branches"
#endif

        if(this->is_ok_) {this->succ_.~success_type();}
        else             {this->fail_.~failure_type();}

#if defined(__GNUC__) && ! defined(__clang__)
#pragma GCC diagnostic pop
#endif
        return;
    }